

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderBuiltinVarTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::sr::anon_unknown_1::BuiltinGlPointCoordCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BuiltinGlPointCoordCaseInstance *this)

{
  TextureFormat TVar1;
  bool bVar2;
  deUint32 dVar3;
  float *__s;
  VkPhysicalDeviceProperties *pVVar4;
  float *pfVar5;
  TestError *this_00;
  int iVar6;
  ulong uVar7;
  int dx;
  int iVar8;
  int iVar9;
  int iVar10;
  iterator coord;
  uint uVar11;
  uint uVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  Surface refImage;
  Surface resImage;
  Random rnd;
  UVec2 viewportSize;
  PixelBufferAccess local_148;
  TestStatus *local_118;
  Surface local_110;
  float local_f4;
  float local_f0;
  int local_ec;
  int local_e8;
  int local_e4;
  float local_e0;
  RGBA local_dc;
  undefined1 local_d8 [16];
  float *local_c8;
  float *local_c0;
  ulong local_b8;
  Surface local_b0;
  undefined1 local_98 [16];
  ConstPixelBufferAccess local_80;
  undefined1 local_58 [16];
  deRandom local_48;
  int local_38;
  int local_34;
  
  local_118 = __return_storage_ptr__;
  ShaderRenderCaseInstance::getViewportSize(&this->super_ShaderRenderCaseInstance);
  __s = (float *)operator_new(0xc0);
  memset(__s,0,0xc0);
  deRandom_init(&local_48,0x145fa);
  tcu::Surface::Surface(&local_b0,local_38,local_34);
  tcu::Surface::Surface(&local_110,local_38,local_34);
  pVVar4 = Context::getDeviceProperties
                     ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
  local_d8._0_4_ = (pVVar4->limits).pointSizeRange[0];
  fVar13 = (pVVar4->limits).pointSizeRange[1];
  local_98 = ZEXT416((uint)fVar13);
  if ((float)local_d8._0_4_ <= fVar13) {
    local_c8 = __s + 0x30;
    fVar13 = ceilf((fVar13 - (float)local_d8._0_4_) / (pVVar4->limits).pointSizeGranularity);
    iVar6 = 1;
    if (1 < (int)fVar13) {
      iVar6 = (int)fVar13;
    }
    pfVar5 = __s;
    do {
      fVar13 = deRandom_getFloat(&local_48);
      *pfVar5 = fVar13 * 1.8 + -0.9;
      fVar13 = deRandom_getFloat(&local_48);
      pfVar5[1] = fVar13 * 1.8 + -0.9;
      dVar3 = deRandom_getUint32(&local_48);
      fVar13 = (float)(int)(dVar3 % (iVar6 + 1U)) * (pVVar4->limits).pointSizeGranularity +
               (float)local_d8._0_4_;
      uVar11 = -(uint)((float)local_98._0_4_ <= fVar13);
      pfVar5[2] = (float)(uVar11 & local_98._0_4_ | ~uVar11 & (uint)fVar13);
      pfVar5 = pfVar5 + 3;
    } while (pfVar5 != local_c8);
    (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[4])(this);
    ShaderRenderCaseInstance::addAttribute
              (&this->super_ShaderRenderCaseInstance,0,VK_FORMAT_R32G32B32_SFLOAT,0xc,0x10,__s);
    local_148.super_ConstPixelBufferAccess.m_format.order = 0x3e000000;
    local_148.super_ConstPixelBufferAccess.m_format.type = 0x3e800000;
    local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = 0x3f000000;
    local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
    ShaderRenderCaseInstance::render
              (&this->super_ShaderRenderCaseInstance,0x10,0,(deUint16 *)0x0,
               VK_PRIMITIVE_TOPOLOGY_POINT_LIST,(Vec4 *)&local_148);
    local_80.m_format.order = RGBA;
    local_80.m_format.type = UNORM_INT8;
    if ((void *)local_b0.m_pixels.m_cap != (void *)0x0) {
      local_b0.m_pixels.m_cap = (size_t)local_b0.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_148,&local_80.m_format,local_b0.m_width,local_b0.m_height,1,
               (void *)local_b0.m_pixels.m_cap);
    tcu::TextureLevel::getAccess(&local_80,&(this->super_ShaderRenderCaseInstance).m_resultImage);
    tcu::copy((EVP_PKEY_CTX *)&local_148,(EVP_PKEY_CTX *)&local_80);
    local_80.m_format.order = RGBA;
    local_80.m_format.type = UNORM_INT8;
    if ((void *)local_110.m_pixels.m_cap != (void *)0x0) {
      local_110.m_pixels.m_cap = (size_t)local_110.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              (&local_148,&local_80.m_format,local_110.m_width,local_110.m_height,1,
               (void *)local_110.m_pixels.m_cap);
    tcu::clear(&local_148,&(this->super_ShaderRenderCaseInstance).m_clearColor);
    local_f4 = (float)local_38;
    local_f0 = (float)local_34;
    pfVar5 = __s;
    do {
      fVar15 = (pfVar5[1] * 0.5 + 0.5) * local_f0;
      local_58 = ZEXT416((uint)fVar15);
      fVar13 = pfVar5[2];
      local_d8 = ZEXT416((uint)fVar13);
      fVar14 = fVar13 * 0.5 + fVar15;
      fVar15 = -fVar13 * 0.5 + fVar15;
      uVar11 = -(uint)(fVar14 < 0.0);
      uVar12 = -(uint)(fVar15 < 0.0);
      uVar12 = (uint)((float)(uVar12 & 0xbf000000 | ~uVar12 & 0x3f000000) + fVar15);
      uVar7 = (ulong)uVar12;
      local_e4 = (int)((float)(uVar11 & 0xbf000000 | ~uVar11 & 0x3f000000) + fVar14) - uVar12;
      local_c0 = pfVar5;
      local_b8 = uVar7;
      if (0 < local_e4) {
        local_e0 = (*pfVar5 * 0.5 + 0.5) * local_f4;
        fVar14 = local_e0 - fVar13 * 0.5;
        uVar11 = -(uint)(fVar14 < 0.0);
        local_ec = (int)((float)(~uVar11 & 0x3f000000 | uVar11 & 0xbf000000) + fVar14);
        fVar13 = fVar13 * 0.5 + local_e0;
        uVar11 = -(uint)(fVar13 < 0.0);
        iVar6 = (int)((float)(~uVar11 & 0x3f000000 | uVar11 & 0xbf000000) + fVar13);
        local_e8 = iVar6 - local_ec;
        iVar9 = 0;
        do {
          if (0 < local_e8) {
            iVar10 = iVar9 + (int)local_b8;
            local_98._0_4_ =
                 (((float)iVar10 + 0.5) - (float)local_58._0_4_) / (float)local_d8._0_4_ + 0.5;
            iVar8 = local_ec;
            do {
              local_148.super_ConstPixelBufferAccess.m_format.type = local_98._0_4_;
              local_148.super_ConstPixelBufferAccess.m_format.order =
                   (ChannelOrder)((((float)iVar8 + 0.5) - local_e0) / (float)local_d8._0_4_ + 0.5);
              local_148.super_ConstPixelBufferAccess.m_size.m_data[0] = 0;
              local_148.super_ConstPixelBufferAccess.m_size.m_data[1] = 0x3f800000;
              if ((((-1 < iVar8) && (iVar8 < local_110.m_width)) && (-1 < iVar10)) &&
                 (iVar10 < local_110.m_height)) {
                tcu::RGBA::RGBA(&local_dc,(Vec4 *)&local_148);
                *(deUint32 *)
                 ((long)local_110.m_pixels.m_ptr +
                 (long)(local_110.m_width * (int)uVar7 + iVar8) * 4) = local_dc.m_value;
              }
              iVar8 = iVar8 + 1;
            } while (iVar6 != iVar8);
          }
          iVar9 = iVar9 + 1;
          uVar7 = (ulong)((int)uVar7 + 1);
        } while (iVar9 != local_e4);
      }
      pfVar5 = local_c0 + 3;
    } while (pfVar5 != local_c8);
    bVar2 = tcu::fuzzyCompare(((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context)
                              ->m_testCtx->m_log,"Result","Image comparison result",&local_110,
                              &local_b0,0.02,COMPARE_LOG_RESULT);
    TVar1 = (TextureFormat)(local_148.super_ConstPixelBufferAccess.m_size.m_data + 2);
    local_148.super_ConstPixelBufferAccess.m_format = TVar1;
    if (bVar2) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_148,"Result image matches reference","");
      local_118->m_code = QP_TEST_RESULT_PASS;
      (local_118->m_description)._M_dataplus._M_p = (pointer)&(local_118->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118->m_description,local_148.super_ConstPixelBufferAccess.m_format
                 ,(undefined1 *)
                  (local_148.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
                  (long)local_148.super_ConstPixelBufferAccess.m_format));
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_148,"Image mismatch","");
      local_118->m_code = QP_TEST_RESULT_FAIL;
      (local_118->m_description)._M_dataplus._M_p = (pointer)&(local_118->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_118->m_description,local_148.super_ConstPixelBufferAccess.m_format
                 ,(undefined1 *)
                  (local_148.super_ConstPixelBufferAccess.m_size.m_data._0_8_ +
                  (long)local_148.super_ConstPixelBufferAccess.m_format));
    }
    if (local_148.super_ConstPixelBufferAccess.m_format != TVar1) {
      operator_delete((void *)local_148.super_ConstPixelBufferAccess.m_format,
                      local_148.super_ConstPixelBufferAccess._16_8_ + 1);
    }
    tcu::Surface::~Surface(&local_110);
    tcu::Surface::~Surface(&local_b0);
    operator_delete(__s,0xc0);
    return local_118;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,(char *)0x0,"minPointSize <= maxPointSize",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderBuiltinVarTests.cpp"
             ,0x212);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

TestStatus BuiltinGlPointCoordCaseInstance::iterate (void)
{
	const UVec2				viewportSize	= getViewportSize();
	const int				width			= viewportSize.x();
	const int				height			= viewportSize.y();
	const float				threshold		= 0.02f;
	const int				numPoints		= 16;
	vector<Vec3>			coords			(numPoints);
	de::Random				rnd				(0x145fa);
	Surface					resImage		(width, height);
	Surface					refImage		(width, height);
	bool					compareOk		= false;

	// Compute coordinates.
	{
		const VkPhysicalDeviceLimits&	limits					= m_context.getDeviceProperties().limits;
		const float						minPointSize			= limits.pointSizeRange[0];
		const float						maxPointSize			= limits.pointSizeRange[1];
		const int						pointSizeDeltaMultiples	= de::max(1, deCeilFloatToInt32((maxPointSize - minPointSize) / limits.pointSizeGranularity));

		TCU_CHECK(minPointSize <= maxPointSize);

		for (vector<Vec3>::iterator coord = coords.begin(); coord != coords.end(); ++coord)
		{
			coord->x() = rnd.getFloat(-0.9f, 0.9f);
			coord->y() = rnd.getFloat(-0.9f, 0.9f);
			coord->z() = de::min(maxPointSize, minPointSize + float(rnd.getInt(0, pointSizeDeltaMultiples)) * limits.pointSizeGranularity);
		}
	}

	setup();
	addAttribute(0u, VK_FORMAT_R32G32B32_SFLOAT, deUint32(sizeof(Vec3)), numPoints, &coords[0]);
	render(numPoints, 0, DE_NULL, VK_PRIMITIVE_TOPOLOGY_POINT_LIST);
	copy(resImage.getAccess(), getResultImage().getAccess());

	// Draw reference
	clear(refImage.getAccess(), m_clearColor);

	for (vector<Vec3>::const_iterator pointIter = coords.begin(); pointIter != coords.end(); ++pointIter)
	{
		const float	centerX	= float(width) *(pointIter->x()*0.5f + 0.5f);
		const float	centerY	= float(height)*(pointIter->y()*0.5f + 0.5f);
		const float	size	= pointIter->z();
		const int	x0		= deRoundFloatToInt32(centerX - size*0.5f);
		const int	y0		= deRoundFloatToInt32(centerY - size*0.5f);
		const int	x1		= deRoundFloatToInt32(centerX + size*0.5f);
		const int	y1		= deRoundFloatToInt32(centerY + size*0.5f);
		const int	w		= x1-x0;
		const int	h		= y1-y0;

		for (int yo = 0; yo < h; yo++)
		{
			for (int xo = 0; xo < w; xo++)
			{
				const int		dx		= x0+xo;
				const int		dy		= y0+yo;
				const float		fragX	= float(dx) + 0.5f;
				const float		fragY	= float(dy) + 0.5f;
				const float		s		= 0.5f + (fragX - centerX) / size;
				const float		t		= 0.5f + (fragY - centerY) / size;
				const Vec4		color	(s, t, 0.0f, 1.0f);

				if (de::inBounds(dx, 0, refImage.getWidth()) && de::inBounds(dy, 0, refImage.getHeight()))
					refImage.setPixel(dx, dy, RGBA(color));
			}
		}
	}

	compareOk = fuzzyCompare(m_context.getTestContext().getLog(), "Result", "Image comparison result", refImage, resImage, threshold, COMPARE_LOG_RESULT);

	if (compareOk)
		return TestStatus::pass("Result image matches reference");
	else
		return TestStatus::fail("Image mismatch");
}